

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O1

int Gia_ManComputeEdgeDelay(Gia_Man_t *p,int fUseTwo)

{
  ulong uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  char *__function;
  int iVar5;
  uint uVar6;
  char *__file;
  char *__assertion;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  float fVar11;
  
  if (p->vEdgeDelay != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdgeDelay->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdgeDelay->pArray = (int *)0x0;
    }
    if (p->vEdgeDelay != (Vec_Int_t *)0x0) {
      free(p->vEdgeDelay);
      p->vEdgeDelay = (Vec_Int_t *)0x0;
    }
  }
  if (p->vEdge1 != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdge1->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdge1->pArray = (int *)0x0;
    }
    if (p->vEdge1 != (Vec_Int_t *)0x0) {
      free(p->vEdge1);
      p->vEdge1 = (Vec_Int_t *)0x0;
    }
  }
  if (p->vEdge2 != (Vec_Int_t *)0x0) {
    piVar4 = p->vEdge2->pArray;
    if (piVar4 != (int *)0x0) {
      free(piVar4);
      p->vEdge2->pArray = (int *)0x0;
    }
    if (p->vEdge2 != (Vec_Int_t *)0x0) {
      free(p->vEdge2);
      p->vEdge2 = (Vec_Int_t *)0x0;
    }
  }
  iVar2 = p->nObjs;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar5 = iVar2;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  lVar10 = (long)iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar10 * 4);
  }
  lVar8 = (long)iVar2;
  pVVar3->pArray = piVar4;
  pVVar3->nSize = iVar2;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,lVar8 * 4);
  }
  p->vEdge1 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar10 * 4);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = iVar2;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,lVar8 * 4);
  }
  p->vEdge2 = pVVar3;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc(lVar10 << 2);
  }
  pVVar3->pArray = piVar4;
  pVVar3->nSize = iVar2;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,lVar8 << 2);
  }
  p->vEdgeDelay = pVVar3;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    if (p->vMapping2 == (Vec_Wec_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                    ,0x1d7,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
    }
    if (((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
       (iVar2 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar2 == 0)) {
      if (1 < p->nObjs) {
        lVar10 = 1;
        lVar8 = 0x14;
        do {
          if (p->vMapping2->nSize <= lVar10) {
LAB_001f88f0:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          if (*(int *)((long)&p->vMapping2->pArray->nCap + lVar8) != 0) {
            Gia_ObjComputeEdgeDelay(p,(int)lVar10,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
          }
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + 0x10;
        } while (lVar10 < p->nObjs);
      }
      goto LAB_001f883b;
    }
    pVVar3 = Gia_ManOrderWithBoxes(p);
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    if (0 < pVVar3->nSize) {
      lVar10 = 0;
      do {
        iVar2 = pVVar3->pArray[lVar10];
        lVar8 = (long)iVar2;
        if ((lVar8 < 0) || (p->nObjs <= iVar2)) goto LAB_001f88d1;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar1 = *(ulong *)(p->pObjs + lVar8);
        uVar7 = (uint)uVar1;
        if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
          uVar6 = (uint)(uVar1 >> 0x20);
          if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
            if (-1 < (int)uVar7) goto LAB_001f890f;
            fVar11 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff);
            if (p->vEdgeDelay->nSize <= iVar2) goto LAB_001f892e;
            p->vEdgeDelay->pArray[lVar8] = (int)fVar11;
          }
          else if ((int)uVar7 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
            uVar9 = iVar2 - (uVar7 & 0x1fffffff);
            if (((int)uVar9 < 0) || (p->vEdgeDelay->nSize <= (int)uVar9)) goto LAB_001f88b2;
            if (-1 < (int)uVar7) goto LAB_001f890f;
            Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff,
                                (float)p->vEdgeDelay->pArray[uVar9]);
          }
          else if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                          ,0x1cd,"int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)");
          }
        }
        else {
          if (p->vMapping2->nSize <= iVar2) goto LAB_001f88f0;
          if (p->vMapping2->pArray[lVar8].nSize != 0) {
            Gia_ObjComputeEdgeDelay(p,iVar2,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar3->nSize);
    }
  }
  else {
    if (((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
       (iVar2 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar2 == 0)) {
      if (1 < p->nObjs) {
        lVar10 = 1;
        do {
          if (p->vMapping->nSize <= lVar10) goto LAB_001f88b2;
          if (p->vMapping->pArray[lVar10] != 0) {
            Gia_ObjComputeEdgeDelay(p,(int)lVar10,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < p->nObjs);
      }
      goto LAB_001f883b;
    }
    pVVar3 = Gia_ManOrderWithBoxes(p);
    Tim_ManIncrementTravId((Tim_Man_t *)p->pManTime);
    if (0 < pVVar3->nSize) {
      lVar10 = 0;
      do {
        iVar2 = pVVar3->pArray[lVar10];
        lVar8 = (long)iVar2;
        if ((lVar8 < 0) || (p->nObjs <= iVar2)) goto LAB_001f88d1;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar1 = *(ulong *)(p->pObjs + lVar8);
        uVar7 = (uint)uVar1;
        if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar7 < 0) {
          uVar6 = (uint)(uVar1 >> 0x20);
          if ((uVar7 & 0x9fffffff) == 0x9fffffff) {
            if (-1 < (int)uVar7) {
LAB_001f890f:
              __assert_fail("pObj->fTerm",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
            }
            fVar11 = Tim_ManGetCiArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff);
            if (p->vEdgeDelay->nSize <= iVar2) {
LAB_001f892e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            p->vEdgeDelay->pArray[lVar8] = (int)fVar11;
          }
          else if ((int)uVar7 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
            uVar9 = iVar2 - (uVar7 & 0x1fffffff);
            if (((int)uVar9 < 0) || (p->vEdgeDelay->nSize <= (int)uVar9)) goto LAB_001f88b2;
            if (-1 < (int)uVar7) goto LAB_001f890f;
            Tim_ManSetCoArrival((Tim_Man_t *)p->pManTime,uVar6 & 0x1fffffff,
                                (float)p->vEdgeDelay->pArray[uVar9]);
          }
          else if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
            __assertion = "0";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
            ;
            __function = "int Gia_ManComputeEdgeDelay(Gia_Man_t *, int)";
            goto LAB_001f88c7;
          }
        }
        else {
          if (p->vMapping->nSize <= iVar2) goto LAB_001f88b2;
          if (p->vMapping->pArray[lVar8] != 0) {
            Gia_ObjComputeEdgeDelay(p,iVar2,p->vEdgeDelay,p->vEdge1,p->vEdge2,fUseTwo);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < pVVar3->nSize);
    }
  }
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
LAB_001f883b:
  lVar10 = (long)p->vCos->nSize;
  if (lVar10 < 1) {
    iVar2 = 0;
  }
  else {
    lVar8 = 0;
    iVar2 = 0;
    do {
      iVar5 = p->vCos->pArray[lVar8];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_001f88d1:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar7 = iVar5 - (*(uint *)(p->pObjs + iVar5) & 0x1fffffff);
      if (((int)uVar7 < 0) || (p->vEdgeDelay->nSize <= (int)uVar7)) {
LAB_001f88b2:
        __assertion = "i >= 0 && i < p->nSize";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h";
        __function = "int Vec_IntEntry(Vec_Int_t *, int)";
LAB_001f88c7:
        __assert_fail(__assertion,__file,0x1a9,__function);
      }
      iVar5 = p->vEdgeDelay->pArray[uVar7];
      if (iVar2 <= iVar5) {
        iVar2 = iVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
  }
  return iVar2;
}

Assistant:

int Gia_ManComputeEdgeDelay( Gia_Man_t * p, int fUseTwo )
{
    int k, iLut, DelayMax = 0;
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    if ( Gia_ManHasMapping(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else if ( Gia_ManHasMapping2(p) )
    {
        if ( p->pManTime != NULL && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) )
        {
            Gia_Obj_t * pObj; 
            Vec_Int_t * vNodes = Gia_ManOrderWithBoxes( p );
            Tim_ManIncrementTravId( (Tim_Man_t*)p->pManTime );
            Gia_ManForEachObjVec( vNodes, p, pObj, k )
            {
                iLut = Gia_ObjId( p, pObj );
                if ( Gia_ObjIsAnd(pObj) )
                {
                    if ( Gia_ObjIsLut2(p, iLut) )
                        Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
                }
                else if ( Gia_ObjIsCi(pObj) )
                {
                    int arrTime = Tim_ManGetCiArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj) );
                    Vec_IntWriteEntry( p->vEdgeDelay,  iLut, arrTime );
                }
                else if ( Gia_ObjIsCo(pObj) )
                {
                    int arrTime = Vec_IntEntry( p->vEdgeDelay, Gia_ObjFaninId0(pObj, iLut) );
                    Tim_ManSetCoArrival( (Tim_Man_t*)p->pManTime, Gia_ObjCioId(pObj), arrTime );
                }
                else if ( !Gia_ObjIsConst0(pObj) ) 
                    assert( 0 );
            }
            Vec_IntFree( vNodes );
        }
        else
        {
            Gia_ManForEachLut2( p, iLut )
                Gia_ObjComputeEdgeDelay( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, fUseTwo );
        }
    }
    else assert( 0 );
    Gia_ManForEachCoDriverId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}